

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O2

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::ImageImplementation::ImageImplementation
          (ImageImplementation *this,OperationContext *context,Resource *resource,
          VkShaderStageFlagBits stage,string *shaderPrefix,AccessMode mode,PipelineType pipelineType
          ,DispatchCall dispatchCall)

{
  Move<vk::Handle<(vk::HandleType)13>_> *this_00;
  VkImageSubresourceRange *pVVar1;
  Move<vk::Handle<(vk::HandleType)13>_> *this_01;
  Move<vk::Handle<(vk::HandleType)21>_> *this_02;
  Move<vk::Handle<(vk::HandleType)19>_> *this_03;
  Move<vk::Handle<(vk::HandleType)22>_> *this_04;
  VkFormat VVar2;
  VkImageType VVar3;
  OperationContext *context_00;
  InstanceInterface *vki;
  DeviceInterface *vk;
  VkDevice device;
  VkPhysicalDevice physDevice;
  Allocator *allocator;
  Allocation *pAVar4;
  Resource *pRVar5;
  PtrData<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_> data;
  PtrData<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_> data_00;
  PtrData<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
  data_01;
  VkPipelineStageFlags VVar6;
  uint uVar7;
  VkDeviceSize VVar8;
  Buffer *this_05;
  Image *pIVar9;
  DescriptorSetLayoutBuilder *pDVar10;
  DescriptorPoolBuilder *pDVar11;
  DescriptorSetUpdateBuilder *pDVar12;
  ComputePipeline *this_06;
  GraphicsPipeline *this_07;
  Image *pIVar13;
  VkImageType viewType;
  Buffer *in_stack_fffffffffffffe68;
  Pipeline *pPVar14;
  undefined8 in_stack_fffffffffffffe70;
  undefined8 uVar15;
  VkDescriptorImageInfo srcImageInfo;
  pointer pVStack_160;
  VkDescriptorImageInfo dstImageInfo;
  pointer pVStack_110;
  undefined1 local_d8 [24];
  pointer pVStack_c0;
  Pipeline *local_78;
  undefined8 uStack_70;
  deUint32 local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  deUint32 local_48;
  Location local_40;
  Location local_38;
  
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__ImageImplementation_00bdd3e0;
  this->m_context = context;
  this->m_resource = resource;
  this->m_stage = stage;
  VVar6 = pipelineStageFlagsFromShaderStageFlagBits(stage);
  this->m_pipelineStage = VVar6;
  this->m_mode = mode;
  this->m_dispatchCall = dispatchCall;
  VVar8 = getPixelBufferSize((resource->m_imageData).format,&(resource->m_imageData).extent);
  this->m_hostBufferSizeBytes = VVar8;
  (this->m_hostBuffer).
  super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>.
  m_data.ptr = (Buffer *)0x0;
  (this->m_image).
  super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>.
  m_data.ptr = (Image *)0x0;
  this_00 = &this->m_srcImageView;
  this_01 = &this->m_dstImageView;
  this_02 = &this->m_descriptorPool;
  this_03 = &this->m_descriptorSetLayout;
  this_04 = &this->m_descriptorSet;
  memset(this_00,0,0xa8);
  context_00 = this->m_context;
  vki = context_00->m_vki;
  vk = context_00->m_vk;
  device = context_00->m_device;
  physDevice = context_00->m_physicalDevice;
  allocator = context_00->m_allocator;
  requireFeaturesForSSBOAccess(context_00,this->m_stage);
  VVar2 = (this->m_resource->m_imageData).format;
  uVar7 = VVar2 - VK_FORMAT_R16_UINT;
  if (((uVar7 < 0x1e) && ((0x3806039fU >> (uVar7 & 0x1f) & 1) != 0)) ||
     ((uVar7 = VVar2 - VK_FORMAT_R8_UNORM, uVar7 < 0x3f &&
      ((0x60000000000019b3U >> ((ulong)uVar7 & 0x3f) & 1) != 0)))) {
    requireFeatures(vki,physDevice,0x40);
  }
  this_05 = (Buffer *)operator_new(0x30);
  makeBufferCreateInfo((VkBufferCreateInfo *)local_d8,this->m_hostBufferSizeBytes,3);
  synchronization::Buffer::Buffer
            (this_05,vk,device,allocator,(VkBufferCreateInfo *)local_d8,(MemoryRequirement)0x1);
  srcImageInfo.sampler.m_internal = 0;
  data._8_8_ = in_stack_fffffffffffffe70;
  data.ptr = in_stack_fffffffffffffe68;
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
  assignData(&(this->m_hostBuffer).
              super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             ,data);
  de::details::
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
  ~UniqueBase((UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
               *)&srcImageInfo);
  pAVar4 = (((this->m_hostBuffer).
             super_UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
             .m_data.ptr)->m_allocation).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (this->m_mode == ACCESS_MODE_READ) {
    memset(pAVar4->m_hostPtr,0,this->m_hostBufferSizeBytes);
  }
  else {
    fillPattern(pAVar4->m_hostPtr,this->m_hostBufferSizeBytes);
  }
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar4->m_memory).m_internal,pAVar4->m_offset,
             this->m_hostBufferSizeBytes);
  pIVar9 = (Image *)operator_new(0x30);
  pRVar5 = this->m_resource;
  makeImageCreateInfo((VkImageCreateInfo *)local_d8,(pRVar5->m_imageData).imageType,
                      &(pRVar5->m_imageData).extent,(pRVar5->m_imageData).format,0xb);
  synchronization::Image::Image
            (pIVar9,vk,device,allocator,(VkImageCreateInfo *)local_d8,(MemoryRequirement)0x0);
  srcImageInfo.sampler.m_internal = 0;
  data_00._8_8_ = in_stack_fffffffffffffe70;
  data_00.ptr = (Image *)in_stack_fffffffffffffe68;
  de::details::
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::
  assignData(&(this->m_image).
              super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
             ,data_00);
  de::details::
  UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>::
  ~UniqueBase((UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
               *)&srcImageInfo);
  pRVar5 = this->m_resource;
  pIVar9 = (this->m_image).
           super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
           .m_data.ptr;
  pIVar13 = (Image *)&pRVar5->m_imageData;
  if (this->m_mode == ACCESS_MODE_READ) {
    pIVar13 = pIVar9;
    pIVar9 = (Image *)&pRVar5->m_imageData;
  }
  this->m_srcImage = (VkImage *)pIVar9;
  this->m_dstImage = (VkImage *)pIVar13;
  VVar3 = (pRVar5->m_imageData).imageType;
  viewType = 7;
  if (VVar3 < VK_IMAGE_TYPE_LAST) {
    viewType = VVar3;
  }
  local_48 = (pRVar5->m_imageData).subresourceRange.layerCount;
  pVVar1 = &(pRVar5->m_imageData).subresourceRange;
  local_58._0_4_ = pVVar1->aspectMask;
  local_58._4_4_ = pVVar1->baseMipLevel;
  uStack_50._0_4_ = (pRVar5->m_imageData).subresourceRange.levelCount;
  uStack_50._4_4_ = (pRVar5->m_imageData).subresourceRange.baseArrayLayer;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&srcImageInfo,vk,device,
                (VkImage)(pIVar9->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                         object.m_internal,viewType,(pRVar5->m_imageData).format,*pVVar1);
  local_d8._16_8_ = srcImageInfo._16_8_;
  pVStack_c0 = pVStack_160;
  local_d8._0_8_ = srcImageInfo.sampler.m_internal;
  local_d8._8_8_ = srcImageInfo.imageView.m_internal;
  srcImageInfo.sampler.m_internal = 0;
  srcImageInfo.imageView.m_internal = 0;
  srcImageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  srcImageInfo._20_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this->m_srcImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)local_d8._16_8_;
  (this->m_srcImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pVStack_c0;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       local_d8._0_8_;
  (this->m_srcImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)local_d8._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&srcImageInfo);
  pRVar5 = this->m_resource;
  local_68 = (pRVar5->m_imageData).subresourceRange.layerCount;
  pVVar1 = &(pRVar5->m_imageData).subresourceRange;
  pPVar14 = *(Pipeline **)pVVar1;
  uVar15._0_4_ = (pRVar5->m_imageData).subresourceRange.levelCount;
  uVar15._4_4_ = (pRVar5->m_imageData).subresourceRange.baseArrayLayer;
  local_78 = pPVar14;
  uStack_70 = uVar15;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&srcImageInfo,vk,device,
                (VkImage)this->m_dstImage->m_internal,viewType,(pRVar5->m_imageData).format,*pVVar1)
  ;
  local_d8._16_8_ = srcImageInfo._16_8_;
  pVStack_c0 = (pointer)0x0;
  local_d8._0_8_ = srcImageInfo.sampler.m_internal;
  local_d8._8_8_ = srcImageInfo.imageView.m_internal;
  srcImageInfo.sampler.m_internal = 0;
  srcImageInfo.imageView.m_internal = 0;
  srcImageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  srcImageInfo._20_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  (this->m_dstImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)local_d8._16_8_;
  (this->m_dstImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pVStack_c0;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       local_d8._0_8_;
  (this->m_dstImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)local_d8._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)13>_> *)&srcImageInfo);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_d8);
  pDVar10 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)local_d8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                       this->m_stage);
  pDVar10 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar10,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,this->m_stage);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&dstImageInfo,pDVar10,vk,device,0);
  srcImageInfo.imageLayout = dstImageInfo.imageLayout;
  srcImageInfo._20_4_ = dstImageInfo._20_4_;
  srcImageInfo.sampler = dstImageInfo.sampler;
  srcImageInfo.imageView = dstImageInfo.imageView;
  dstImageInfo.sampler.m_internal = 0;
  dstImageInfo.imageView.m_internal = 0;
  dstImageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  dstImageInfo._20_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
            (&this_03->super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = (VkDevice)srcImageInfo._16_8_;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)pVStack_110;
  (this_03->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       srcImageInfo.sampler.m_internal;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)srcImageInfo.imageView.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)19>_> *)&dstImageInfo);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)local_d8);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&dstImageInfo);
  pDVar11 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&dstImageInfo,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  pDVar11 = ::vk::DescriptorPoolBuilder::addType(pDVar11,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&srcImageInfo,pDVar11,vk,device,1,1);
  local_d8._16_8_ = srcImageInfo._16_8_;
  pVStack_c0 = pVStack_110;
  local_d8._0_8_ = srcImageInfo.sampler.m_internal;
  local_d8._8_8_ = srcImageInfo.imageView.m_internal;
  srcImageInfo.sampler.m_internal = 0;
  srcImageInfo.imageView.m_internal = 0;
  srcImageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  srcImageInfo._20_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            (&this_02->super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)local_d8._16_8_;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)pVStack_c0;
  (this_02->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
       local_d8._0_8_;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_d8._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&srcImageInfo);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&dstImageInfo);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&srcImageInfo,vk,device,
                    (VkDescriptorPool)
                    (this_02->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.
                    m_internal,
                    (VkDescriptorSetLayout)
                    (this_03->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.
                    m_internal);
  local_d8._16_8_ = srcImageInfo._16_8_;
  pVStack_c0 = (pointer)0x0;
  local_d8._0_8_ = srcImageInfo.sampler.m_internal;
  local_d8._8_8_ = srcImageInfo.imageView.m_internal;
  srcImageInfo.sampler.m_internal = 0;
  srcImageInfo.imageView.m_internal = 0;
  srcImageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  srcImageInfo._20_4_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
            (&this_04->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)local_d8._16_8_;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
  m_internal = (deUint64)pVStack_c0;
  (this_04->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
       local_d8._0_8_;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_d8._8_8_;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&srcImageInfo);
  srcImageInfo.imageView.m_internal =
       (this_00->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  srcImageInfo.sampler.m_internal = 0;
  srcImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
  dstImageInfo.imageView.m_internal =
       (this_01->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  dstImageInfo.sampler.m_internal = 0;
  dstImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_d8);
  local_38.m_binding = 0;
  local_38.m_arrayElement = 0;
  pDVar12 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)local_d8,
                       (VkDescriptorSet)
                       (this_04->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.
                       m_internal,&local_38,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,&srcImageInfo);
  local_40.m_binding = 1;
  local_40.m_arrayElement = 0;
  pDVar12 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar12,(VkDescriptorSet)
                               (this_04->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.
                               object.m_internal,&local_40,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                       &dstImageInfo);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar12,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)local_d8);
  if (pipelineType == PIPELINE_TYPE_GRAPHICS) {
    this_07 = (GraphicsPipeline *)operator_new(0x120);
    GraphicsPipeline::GraphicsPipeline
              (this_07,context,stage,shaderPrefix,
               (VkDescriptorSetLayout)
               (this_03->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal);
  }
  else {
    this_06 = (ComputePipeline *)operator_new(0x60);
    ComputePipeline::ComputePipeline
              (this_06,context,this->m_dispatchCall,shaderPrefix,
               (VkDescriptorSetLayout)
               (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
               object.m_internal);
  }
  local_d8._0_8_ = (pointer)0x0;
  data_01._8_8_ = uVar15;
  data_01.ptr = pPVar14;
  de::details::
  MovePtr<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
  ::operator=(&this->m_pipeline,data_01);
  de::details::
  UniqueBase<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
  ::~UniqueBase((UniqueBase<vkt::synchronization::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<vkt::synchronization::(anonymous_namespace)::Pipeline>_>
                 *)local_d8);
  return;
}

Assistant:

ImageImplementation (OperationContext&				context,
						 Resource&						resource,
						 const VkShaderStageFlagBits	stage,
						 const std::string&				shaderPrefix,
						 const AccessMode				mode,
						 const PipelineType				pipelineType,
						 const DispatchCall				dispatchCall)
		: m_context				(context)
		, m_resource			(resource)
		, m_stage				(stage)
		, m_pipelineStage		(pipelineStageFlagsFromShaderStageFlagBits(m_stage))
		, m_mode				(mode)
		, m_dispatchCall		(dispatchCall)
		, m_hostBufferSizeBytes	(getPixelBufferSize(m_resource.getImage().format, m_resource.getImage().extent))
	{
		const DeviceInterface&		vk			= m_context.getDeviceInterface();
		const InstanceInterface&	vki			= m_context.getInstanceInterface();
		const VkDevice				device		= m_context.getDevice();
		const VkPhysicalDevice		physDevice	= m_context.getPhysicalDevice();
		Allocator&					allocator	= m_context.getAllocator();

		// Image stores are always required, in either access mode.
		requireFeaturesForSSBOAccess(m_context, m_stage);

		// Some storage image formats require additional capability.
		if (isStorageImageExtendedFormat(m_resource.getImage().format))
			requireFeatures(vki, physDevice, FEATURE_SHADER_STORAGE_IMAGE_EXTENDED_FORMATS);

		m_hostBuffer = de::MovePtr<Buffer>(new Buffer(
			vk, device, allocator, makeBufferCreateInfo(m_hostBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT),
			MemoryRequirement::HostVisible));

		// Init host buffer data
		{
			const Allocation& alloc = m_hostBuffer->getAllocation();
			if (m_mode == ACCESS_MODE_READ)
				deMemset(alloc.getHostPtr(), 0, static_cast<size_t>(m_hostBufferSizeBytes));
			else
				fillPattern(alloc.getHostPtr(), m_hostBufferSizeBytes);
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_hostBufferSizeBytes);
		}

		// Image resources
		{
			m_image = de::MovePtr<Image>(new Image(vk, device, allocator,
				makeImageCreateInfo(m_resource.getImage().imageType, m_resource.getImage().extent, m_resource.getImage().format,
									VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_STORAGE_BIT),
				MemoryRequirement::Any));

			if (m_mode == ACCESS_MODE_READ)
			{
				m_srcImage = &m_resource.getImage().handle;
				m_dstImage = &(**m_image);
			}
			else
			{
				m_srcImage = &(**m_image);
				m_dstImage = &m_resource.getImage().handle;
			}

			const VkImageViewType viewType = getImageViewType(m_resource.getImage().imageType);

			m_srcImageView	= makeImageView(vk, device, *m_srcImage, viewType, m_resource.getImage().format, m_resource.getImage().subresourceRange);
			m_dstImageView	= makeImageView(vk, device, *m_dstImage, viewType, m_resource.getImage().format, m_resource.getImage().subresourceRange);
		}

		// Prepare descriptors
		{
			m_descriptorSetLayout = DescriptorSetLayoutBuilder()
				.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, m_stage)
				.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, m_stage)
				.build(vk, device);

			m_descriptorPool = DescriptorPoolBuilder()
				.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
				.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
				.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

			m_descriptorSet = makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

			const VkDescriptorImageInfo srcImageInfo = makeDescriptorImageInfo(DE_NULL, *m_srcImageView, VK_IMAGE_LAYOUT_GENERAL);
			const VkDescriptorImageInfo dstImageInfo = makeDescriptorImageInfo(DE_NULL, *m_dstImageView, VK_IMAGE_LAYOUT_GENERAL);

			DescriptorSetUpdateBuilder()
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &srcImageInfo)
				.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &dstImageInfo)
				.update(vk, device);
		}

		// Create pipeline
		m_pipeline = (pipelineType == PIPELINE_TYPE_GRAPHICS ? de::MovePtr<Pipeline>(new GraphicsPipeline(context, stage, shaderPrefix, *m_descriptorSetLayout))
															 : de::MovePtr<Pipeline>(new ComputePipeline(context, m_dispatchCall, shaderPrefix, *m_descriptorSetLayout)));
	}